

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::BinaryExpressionSyntax::isKind(SyntaxKind kind)

{
  if ((((0x3e < kind - InequalityExpression) ||
       ((0x60030007f8030001U >> ((ulong)(kind - InequalityExpression) & 0x3f) & 1) == 0)) &&
      ((CaseInequalityExpression < kind || ((0x2801c201007810c0U >> ((ulong)kind & 0x3f) & 1) == 0))
      )) && ((((0x27 < kind - EqualityExpression ||
               ((0xc000000001U >> ((ulong)(kind - EqualityExpression) & 0x3f) & 1) == 0)) &&
              ((0x28 < kind - NonblockingAssignmentExpression ||
               ((0x10000000021U >> ((ulong)(kind - NonblockingAssignmentExpression) & 0x3f) & 1) ==
                0)))) &&
             ((((0xb < kind - WildcardEqualityExpression ||
                ((0x803U >> (kind - WildcardEqualityExpression & 0x1f) & 1) == 0)) &&
               (1 < kind - DivideAssignmentExpression)) && (1 < kind - SubtractAssignmentExpression)
              ))))) {
    return false;
  }
  return true;
}

Assistant:

bool BinaryExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::AddExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::PowerExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::XorAssignmentExpression:
            return true;
        default:
            return false;
    }
}